

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.h
# Opt level: O2

unique_color * __thiscall crnlib::unique_color::operator=(unique_color *this,unique_color *param_1)

{
  (this->m_color).field_0.field_0.r = (param_1->m_color).field_0.field_0.r;
  (this->m_color).field_0.field_0.g = (param_1->m_color).field_0.field_0.g;
  (this->m_color).field_0.field_0.b = (param_1->m_color).field_0.field_0.b;
  (this->m_color).field_0.field_0.a = (param_1->m_color).field_0.field_0.a;
  this->m_weight = param_1->m_weight;
  return this;
}

Assistant:

struct CRN_EXPORT unique_color
    {
        inline unique_color()
        {
        }
        inline unique_color(const color_quad_u8& color, uint weight) :
            m_color(color),
            m_weight(weight)
        {
        }

        color_quad_u8 m_color;
        uint m_weight;

        inline bool operator<(const unique_color& c) const
        {
            return *reinterpret_cast<const uint32*>(&m_color) < *reinterpret_cast<const uint32*>(&c.m_color);
        }

        inline bool operator==(const unique_color& c) const
        {
            return *reinterpret_cast<const uint32*>(&m_color) == *reinterpret_cast<const uint32*>(&c.m_color);
        }
    }